

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

void vkt::shaderexecutor::anon_unknown_0::generateFragShaderOutputDecl
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *outLocationMap,string *outputPrefix)

{
  long *plVar1;
  pointer key;
  int iVar2;
  DataType DVar3;
  int iVar4;
  uint *puVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  InternalError *this;
  uint uVar9;
  ulong uVar10;
  undefined7 in_register_00000011;
  VarType *this_00;
  pointer pSVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outVarName;
  VariableDeclaration decl;
  VarType uintType;
  VarType intType;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined8 uStack_2b8;
  ulong *local_2b0;
  long local_2a8;
  ulong local_2a0 [2];
  ostream *local_290;
  ulong *local_288;
  long local_280;
  ulong local_278 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ShaderSpec *local_248;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  ulong local_230;
  ulong local_228;
  undefined1 local_220 [64];
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  VarType local_1c0;
  VarType local_1a8 [4];
  ios_base local_138 [264];
  
  local_240 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)CONCAT71(in_register_00000011,useIntOutputs);
  pSVar11 = (shaderSpec->outputs).
            super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(shaderSpec->outputs).
                              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) >> 3) *
          -0x49249249) {
    uVar10 = 0;
    local_290 = src;
    local_248 = shaderSpec;
    local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)outLocationMap;
    do {
      key = pSVar11 + uVar10;
      local_230 = uVar10;
      puVar5 = (uint *)de::
                       lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                                 (local_240,&key->name);
      uVar9 = *puVar5;
      std::operator+(&local_268,local_238,&key->name);
      local_228 = (ulong)uVar9;
      glu::Layout::Layout((Layout *)local_1a8,uVar9,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_220,&pSVar11[uVar10].varType,&local_268,STORAGE_OUT,
                 INTERPOLATION_LAST,(Layout *)local_1a8,0);
      poVar6 = local_290;
      if (pSVar11[uVar10].varType.m_type != TYPE_BASIC) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,(char *)0x0,"output.varType.isBasicType()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
                   ,0xd5);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      DVar3 = (key->varType).m_data.basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        iVar2 = glu::getDataTypeScalarSize(DVar3);
        poVar6 = local_290;
        DVar3 = TYPE_INT;
        if (1 < iVar2) {
          DVar3 = glu::getDataTypeIntVec(iVar2);
        }
        glu::VarType::VarType(local_1a8,DVar3,PRECISION_HIGHP);
        glu::VarType::operator=((VarType *)(local_220 + 0x20),local_1a8);
        poVar6 = glu::operator<<(poVar6,(VariableDeclaration *)local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
        this_00 = local_1a8;
LAB_008306ff:
        glu::VarType::~VarType(this_00);
      }
      else {
        if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
          iVar2 = glu::getDataTypeMatrixNumRows(DVar3);
          iVar4 = glu::getDataTypeMatrixNumColumns((key->varType).m_data.basic.type);
          DVar3 = glu::getDataTypeUintVec(iVar2);
          glu::VarType::VarType(&local_1c0,DVar3,PRECISION_HIGHP);
          glu::VarType::operator=((VarType *)(local_220 + 0x20),&local_1c0);
          if (0 < iVar4) {
            iVar2 = 0;
            do {
              local_2b0 = local_2a0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,local_268._M_dataplus._M_p,
                         local_268._M_dataplus._M_p + local_268._M_string_length);
              std::__cxx11::string::append((char *)&local_2b0);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::ostream::operator<<(local_1a8,iVar2);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              uVar10 = 0xf;
              if (local_2b0 != local_2a0) {
                uVar10 = local_2a0[0];
              }
              if (uVar10 < (ulong)(local_280 + local_2a8)) {
                uVar10 = 0xf;
                if (local_288 != local_278) {
                  uVar10 = local_278[0];
                }
                if (uVar10 < (ulong)(local_280 + local_2a8)) goto LAB_008305f2;
                puVar7 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_288,0,(char *)0x0,(ulong)local_2b0);
              }
              else {
LAB_008305f2:
                puVar7 = (undefined8 *)
                         std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_288);
              }
              local_2d0 = &local_2c0;
              plVar1 = puVar7 + 2;
              if ((long *)*puVar7 == plVar1) {
                local_2c0 = *plVar1;
                uStack_2b8 = puVar7[3];
              }
              else {
                local_2c0 = *plVar1;
                local_2d0 = (long *)*puVar7;
              }
              local_2c8 = puVar7[1];
              *puVar7 = plVar1;
              puVar7[1] = 0;
              *(undefined1 *)plVar1 = 0;
              std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_2d0);
              if (local_2d0 != &local_2c0) {
                operator_delete(local_2d0,local_2c0 + 1);
              }
              if (local_288 != local_278) {
                operator_delete(local_288,local_278[0] + 1);
              }
              if (local_2b0 != local_2a0) {
                operator_delete(local_2b0,local_2a0[0] + 1);
              }
              local_220._0_4_ = (int)local_228 + iVar2;
              poVar8 = glu::operator<<(poVar6,(VariableDeclaration *)local_220);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
              iVar2 = iVar2 + 1;
            } while (iVar4 != iVar2);
          }
          this_00 = &local_1c0;
          goto LAB_008306ff;
        }
        poVar6 = glu::operator<<(local_290,(VariableDeclaration *)local_220);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_p != &local_1d0) {
        operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType((VarType *)(local_220 + 0x20));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (int)local_230 + 1;
      uVar10 = (ulong)uVar9;
      pSVar11 = (local_248->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = (int)((ulong)((long)(local_248->outputs).
                                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) >> 3);
    } while (SBORROW4(uVar9,iVar2 * -0x49249249) != (int)(uVar9 + iVar2 * 0x49249249) < 0);
  }
  return;
}

Assistant:

static void generateFragShaderOutputDecl (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::map<std::string, int>& outLocationMap, const std::string& outputPrefix)
{
	for (int outNdx = 0; outNdx < (int)shaderSpec.outputs.size(); ++outNdx)
	{
		const Symbol&				output		= shaderSpec.outputs[outNdx];
		const int					location	= de::lookup(outLocationMap, output.name);
		const std::string			outVarName	= outputPrefix + output.name;
		glu::VariableDeclaration	decl		(output.varType, outVarName, glu::STORAGE_OUT, glu::INTERPOLATION_LAST, glu::Layout(location));

		TCU_CHECK_INTERNAL(output.varType.isBasicType());

		if (useIntOutputs && glu::isDataTypeFloatOrVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= vecSize > 1 ? glu::getDataTypeUintVec(vecSize) : glu::TYPE_UINT;
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeScalarSize(output.varType.getBasicType());
			const glu::DataType	intBasicType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;
			const glu::VarType	intType			(intBasicType, glu::PRECISION_HIGHP);

			decl.varType = intType;
			src << decl << ";\n";
		}
		else if (glu::isDataTypeMatrix(output.varType.getBasicType()))
		{
			const int			vecSize			= glu::getDataTypeMatrixNumRows(output.varType.getBasicType());
			const int			numVecs			= glu::getDataTypeMatrixNumColumns(output.varType.getBasicType());
			const glu::DataType	uintBasicType	= glu::getDataTypeUintVec(vecSize);
			const glu::VarType	uintType		(uintBasicType, glu::PRECISION_HIGHP);

			decl.varType = uintType;
			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
			{
				decl.name				= outVarName + "_" + de::toString(vecNdx);
				decl.layout.location	= location + vecNdx;
				src << decl << ";\n";
			}
		}
		else
			src << decl << ";\n";
	}
}